

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzerResults.cpp
# Opt level: O2

void __thiscall
MDIOAnalyzerResults::GenerateFrameTabularText
          (MDIOAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  char *pcVar1;
  Frame frame;
  ulonglong local_c0;
  undefined1 local_b0;
  char local_af;
  char number_str [128];
  
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)&frame);
  switch(local_b0) {
  case 0:
    pcVar1 = "22";
    goto LAB_0010792b;
  case 1:
    pcVar1 = "45";
LAB_0010792b:
    AnalyzerResults::AddTabularText
              ((char *)this,"START C",pcVar1,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case 2:
    pcVar1 = "Write";
    goto LAB_0010799c;
  case 3:
    pcVar1 = "Read";
    goto LAB_0010799c;
  case 4:
    pcVar1 = "Address";
    goto LAB_0010799c;
  case 5:
    pcVar1 = "Read-Increment-Address";
LAB_0010799c:
    AnalyzerResults::AddTabularText((char *)this,"OPCODE [",pcVar1,"]",(char *)0x0,(char *)0x0);
    break;
  case 6:
    AnalyzerHelpers::GetNumberString(local_c0,display_base,5,number_str,0x80);
    AnalyzerResults::AddTabularText
              ((char *)this,"PHY Address [",number_str,"]",(char *)0x0,(char *)0x0);
    break;
  case 7:
    AnalyzerHelpers::GetNumberString(local_c0,display_base,5,number_str,0x80);
    AnalyzerResults::AddTabularText
              ((char *)this,"Register Address [",number_str,"]",(char *)0x0,(char *)0x0);
    break;
  case 8:
    AnalyzerHelpers::GetNumberString(local_c0,display_base,5,number_str,0x80);
    AnalyzerResults::AddTabularText
              ((char *)this,"DEVTYPE [","Reserved","] - ",number_str,(char *)0x0);
    break;
  case 9:
    AnalyzerHelpers::GetNumberString(local_c0,display_base,5,number_str,0x80);
    AnalyzerResults::AddTabularText
              ((char *)this,"DEVTYPE [","PMD/PMA","] - ",number_str,(char *)0x0);
    break;
  case 10:
    AnalyzerHelpers::GetNumberString(local_c0,display_base,5,number_str,0x80);
    AnalyzerResults::AddTabularText((char *)this,"DEVTYPE [","WIS","] - ",number_str,(char *)0x0);
    break;
  case 0xb:
    AnalyzerHelpers::GetNumberString(local_c0,display_base,5,number_str,0x80);
    AnalyzerResults::AddTabularText((char *)this,"DEVTYPE [","PCS","] - ",number_str,(char *)0x0);
    break;
  case 0xc:
    AnalyzerHelpers::GetNumberString(local_c0,display_base,5,number_str,0x80);
    AnalyzerResults::AddTabularText((char *)this,"DEVTYPE [","PHY XS","] - ",number_str,(char *)0x0)
    ;
    break;
  case 0xd:
    AnalyzerHelpers::GetNumberString(local_c0,display_base,5,number_str,0x80);
    AnalyzerResults::AddTabularText((char *)this,"DEVTYPE [","DTE XS","] - ",number_str,(char *)0x0)
    ;
    break;
  case 0xe:
    AnalyzerHelpers::GetNumberString(local_c0,display_base,5,number_str,0x80);
    AnalyzerResults::AddTabularText((char *)this,"DEVTYPE [","Other","] - ",number_str,(char *)0x0);
    break;
  case 0xf:
    pcVar1 = "!Turnaround";
    if (-1 < local_af) {
      pcVar1 = "Turnaround";
    }
    goto LAB_00107b2c;
  case 0x10:
    AnalyzerHelpers::GetNumberString(local_c0,display_base,0x10,number_str,0x80);
    AnalyzerResults::AddTabularText((char *)this,"Data [",number_str,"]",(char *)0x0,(char *)0x0);
    break;
  case 0x11:
    AnalyzerHelpers::GetNumberString(local_c0,display_base,0x10,number_str,0x80);
    AnalyzerResults::AddTabularText((char *)this,"Address"," [",number_str,"]",(char *)0x0);
    break;
  case 0x12:
    AnalyzerHelpers::GetNumberString(local_c0,display_base,0x10,number_str,0x80);
    AnalyzerResults::AddTabularText((char *)this,"Data"," [",number_str,"]",(char *)0x0);
    break;
  case 0x13:
    pcVar1 = "!Unknown";
LAB_00107b2c:
    AnalyzerResults::AddTabularText
              ((char *)this,pcVar1,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  Frame::~Frame(&frame);
  return;
}

Assistant:

void MDIOAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();

    Frame frame = GetFrame( frame_index );

    switch( frame.mType )
    {
    case MDIO_C22_START:
        AddTabularText( "START C", "22" );
        break;

    case MDIO_C45_START:
        AddTabularText( "START C", "45" );
        break;

    case MDIO_OP_W:
        AddTabularText( "OPCODE [", "Write", "]" );
        break;

    case MDIO_OP_R:
        AddTabularText( "OPCODE [", "Read", "]" );
        break;

    case MDIO_C45_OP_ADDR:
        AddTabularText( "OPCODE [", "Address", "]" );
        break;

    case MDIO_C45_OP_READ_INC_ADDR:
        AddTabularText( "OPCODE [", "Read-Increment-Address", "]" );
        break;

    case MDIO_PHYADDR:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );
        AddTabularText( "PHY Address [", number_str, "]" );
    }
    break;

    case MDIO_C22_REGADDR:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );
        AddTabularText( "Register Address [", number_str, "]" );
    }
    break;

    case MDIO_C45_DEVTYPE_RESERVED:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );
        AddTabularText( "DEVTYPE [", "Reserved", "] - ", number_str );
    }
    break;

    case MDIO_C45_DEVTYPE_PMD_PMA:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );
        AddTabularText( "DEVTYPE [", "PMD/PMA", "] - ", number_str );
    }
    break;

    case MDIO_C45_DEVTYPE_WIS:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );
        AddTabularText( "DEVTYPE [", "WIS", "] - ", number_str );
    }
    break;

    case MDIO_C45_DEVTYPE_PCS:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );
        AddTabularText( "DEVTYPE [", "PCS", "] - ", number_str );
    }
    break;
    case MDIO_C45_DEVTYPE_PHY_XS:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );
        AddTabularText( "DEVTYPE [", "PHY XS", "] - ", number_str );
    }
    break;
    case MDIO_C45_DEVTYPE_DTE_XS:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );
        AddTabularText( "DEVTYPE [", "DTE XS", "] - ", number_str );
    }
    break;
    case MDIO_C45_DEVTYPE_OTHER:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );
        AddTabularText( "DEVTYPE [", "Other", "] - ", number_str );
    }
    break;
    case MDIO_TA:
        if( frame.mFlags & DISPLAY_AS_ERROR_FLAG )
        {
            AddTabularText( "!Turnaround" );
        }
        else
        {
            AddTabularText( "Turnaround" );
        }
        break;

    case MDIO_C22_DATA:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 16, number_str, 128 );
        AddTabularText( "Data [", number_str, "]" );
    }
    break;

    case MDIO_C45_ADDR:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 16, number_str, 128 );
        AddTabularText( "Address", " [", number_str, "]" );
    }
    break;

    case MDIO_C45_DATA:
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 16, number_str, 128 );
        AddTabularText( "Data", " [", number_str, "]" );
    }
    break;

    case MDIO_UNKNOWN:
        AddTabularText( "!Unknown" );
        break;
    }
}